

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O1

int __thiscall
bdConnectManager::recvedConnectionStart
          (bdConnectManager *this,bdId *id,bdId *srcConnAddr,bdId *destConnAddr,int mode,
          int delayOrBandwidth)

{
  int iVar1;
  bdConnection *this_00;
  int delay;
  
  this_00 = findExistingConnectionBySender(this,id,srcConnAddr,destConnAddr);
  iVar1 = 0;
  if (this_00 != (bdConnection *)0x0) {
    if (this_00->mPoint == 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "bdConnectManager::recvedConnectionStart() ERROR We Are Connection MID Point",0x4b)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
    }
    if ((this_00->mState == 3) || (this_00->mState == 5)) {
      delay = 0;
      (*this->mPub->_vptr_bdNodePublisher[2])
                (this->mPub,id,0x68,&this_00->mSrcId,&this_00->mDestId,(ulong)(uint)mode,0,0);
      iVar1 = 1;
      if (this_00->mState != 5) {
        iVar1 = delayOrBandwidth;
        if (this_00->mMode != 4) {
          delay = delayOrBandwidth;
          iVar1 = 0;
        }
        bdConnection::CompleteConnection(this_00,id,srcConnAddr,destConnAddr,iVar1,delay);
        if (this_00->mPoint == 1) {
          callbackConnectRequest
                    (this,&this_00->mSrcConnAddr,&this_00->mProxyId,&this_00->mDestConnAddr,
                     this_00->mMode,1,delayOrBandwidth,3,0);
          iVar1 = 1;
        }
        else {
          callbackConnectRequest
                    (this,&this_00->mSrcConnAddr,&this_00->mProxyId,&this_00->mDestConnAddr,
                     this_00->mMode,this_00->mPoint,delayOrBandwidth,3,0);
          iVar1 = 1;
        }
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "bdConnectManager::recvedConnectionStart() ERROR State != WAITING_START && != COMPLETED"
                 ,0x56);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int bdConnectManager::recvedConnectionStart(bdId *id, bdId *srcConnAddr, bdId *destConnAddr, int mode, int delayOrBandwidth) {
#ifdef DEBUG_NODE_CONNECTION
	std::cerr << "bdConnectManager::recvedConnectionStart()";
	std::cerr << std::endl;
#endif
	/* retrieve existing connection data */
	bdConnection *conn = findExistingConnectionBySender(id, srcConnAddr, destConnAddr);
	if (!conn) {
		/* ERROR */
#ifdef DEBUG_NODE_CONNECTION
		std::cerr << "bdConnectManager::recvedConnectionStart() ERROR NO EXISTING CONNECTION";
		std::cerr << std::endl;
#endif
		return 0;
	}

	if (conn->mPoint == BD_PROXY_CONNECTION_MID_POINT) {
		std::cerr << "bdConnectManager::recvedConnectionStart() ERROR We Are Connection MID Point";
		std::cerr << std::endl;
		/* ERROR */
	}
	/* check state */
	if ((conn->mState != BITDHT_CONNECTION_WAITING_START) && (conn->mState != BITDHT_CONNECTION_COMPLETED)) {
		/* ERROR */
		std::cerr << "bdConnectManager::recvedConnectionStart() ERROR State != WAITING_START && != COMPLETED";
		std::cerr << std::endl;

		return 0;
	}
	/* ALL Okay, Send ACK */
#ifdef DEBUG_NODE_CONNECTION
	std::cerr << "bdConnectManager::recvedConnectionStart() Passed basic tests, Okay to send ACK";
	std::cerr << std::endl;
#endif
	int msgtype = BITDHT_MSG_TYPE_CONNECT_ACK;
	int status = BITDHT_CONNECT_ANSWER_OKAY;
	mPub->send_connect_msg(id, msgtype, &(conn->mSrcId), &(conn->mDestId), mode, 0, status);

	/* do complete Callback */

	/* flag as completed */
	if (conn->mState != BITDHT_CONNECTION_COMPLETED) {
#ifdef DEBUG_NODE_CONNECTION
		std::cerr << "bdConnectManager::recvedConnectionStart() Switching State to COMPLETED, doing callback";
		std::cerr << std::endl;
#endif

		int param = delayOrBandwidth;
		int bandwidth = 0;
		int delay = 0;
		if (conn->mMode == BITDHT_CONNECT_MODE_RELAY)
			bandwidth = param;
		else
			delay = param;
		conn->CompleteConnection(id, srcConnAddr, destConnAddr, bandwidth, delay);
#ifdef DEBUG_NODE_CONNECTION
		std::cerr << "bdConnectManager::recvedConnectionStart() Connection State: ";
		std::cerr << *conn;
		std::cerr << std::endl;
#endif
		// TODO: Why are if and else identical?
		if (conn->mPoint == BD_PROXY_CONNECTION_START_POINT) {
			/* internal callback first */
			callbackConnectRequest(&(conn->mSrcConnAddr),&(conn->mProxyId),&(conn->mDestConnAddr),
							conn->mMode, conn->mPoint, param, BITDHT_CONNECT_CB_START,
							BITDHT_CONNECT_ERROR_NONE);
		} else {
			/* internal callback first */
			callbackConnectRequest(&(conn->mSrcConnAddr),&(conn->mProxyId),&(conn->mDestConnAddr),
							conn->mMode, conn->mPoint, param, BITDHT_CONNECT_CB_START,
							BITDHT_CONNECT_ERROR_NONE);
		}
	} else {
#ifdef DEBUG_NODE_CONNECTION
		std::cerr << "bdConnectManager::recvedConnectionStart() Just sent duplicate ACK";
		std::cerr << std::endl;
#endif
	}
	/* don't delete, if ACK is lost, we want to be able to re-respond */
	return 1;
}